

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O0

int Cba_CommandWrite(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Cba_Man_t *p_00;
  char *pcVar3;
  char *local_50;
  int fVerbose;
  int c;
  int fInclineCats;
  char *pFileName;
  Cba_Man_t *p;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p_00 = Cba_AbcGetMan(pAbc);
  fVerbose = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"cvh"), iVar2 != -1) {
    if (iVar2 == 99) {
      fVerbose = fVerbose ^ 1;
    }
    else {
      if ((iVar2 == 0x68) || (iVar2 != 0x76)) {
        Abc_Print(-2,"usage: @write [-cvh]\n");
        Abc_Print(-2,"\t         writes the design into a file in BLIF or Verilog\n");
        pcVar3 = "no";
        if (fVerbose != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-c     : toggle inlining input concatenations [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (bVar1) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
  }
  if (p_00 == (Cba_Man_t *)0x0) {
    Abc_Print(1,"Cba_CommandWrite(): There is no current design.\n");
  }
  else {
    if (argc == globalUtilOptind + 1) {
      _c = argv[globalUtilOptind];
    }
    else {
      if ((argc != globalUtilOptind) || (p_00 == (Cba_Man_t *)0x0)) {
        printf("Output file name should be given on the command line.\n");
        return 0;
      }
      pcVar3 = Cba_ManSpec(p_00);
      if (pcVar3 == (char *)0x0) {
        local_50 = Cba_ManName(p_00);
      }
      else {
        local_50 = Cba_ManSpec(p_00);
      }
      _c = Extra_FileNameGenericAppend(local_50,"_out.v");
      printf("Generated output file name \"%s\".\n",_c);
    }
    pcVar3 = Extra_FileNameExtension(_c);
    iVar2 = strcmp(pcVar3,"blif");
    if (iVar2 == 0) {
      Cba_ManWriteBlif(_c,p_00);
    }
    else {
      pcVar3 = Extra_FileNameExtension(_c);
      iVar2 = strcmp(pcVar3,"v");
      if (iVar2 == 0) {
        Cba_ManWriteVerilog(_c,p_00,fVerbose);
      }
      else {
        pcVar3 = Extra_FileNameExtension(_c);
        iVar2 = strcmp(pcVar3,"cba");
        if (iVar2 != 0) {
          printf("Unrecognized output file extension.\n");
          return 0;
        }
        Cba_ManWriteCba(_c,p_00);
      }
    }
  }
  return 0;
}

Assistant:

int Cba_CommandWrite( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cba_Man_t * p = Cba_AbcGetMan(pAbc);
    char * pFileName = NULL;
    int fInclineCats =    0;
    int c, fVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fInclineCats ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Cba_CommandWrite(): There is no current design.\n" );
        return 0;
    }

    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else if ( argc == globalUtilOptind && p )
    {
        pFileName = Extra_FileNameGenericAppend( Cba_ManSpec(p) ? Cba_ManSpec(p) : Cba_ManName(p), "_out.v" );
        printf( "Generated output file name \"%s\".\n", pFileName );
    }
    else 
    {
        printf( "Output file name should be given on the command line.\n" );
        return 0;
    }
    // perform writing
    if ( !strcmp( Extra_FileNameExtension(pFileName), "blif" )  )
        Cba_ManWriteBlif( pFileName, p );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "v" )  )
        Cba_ManWriteVerilog( pFileName, p, fInclineCats );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "cba" )  )
        Cba_ManWriteCba( pFileName, p );
    else 
    {
        printf( "Unrecognized output file extension.\n" );
        return 0;
    }
    return 0;
usage:
    Abc_Print( -2, "usage: @write [-cvh]\n" );
    Abc_Print( -2, "\t         writes the design into a file in BLIF or Verilog\n" );
    Abc_Print( -2, "\t-c     : toggle inlining input concatenations [default = %s]\n",  fInclineCats? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}